

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

bool __thiscall
Wasm::PolymorphicEmitInfo::IsEquivalent(PolymorphicEmitInfo *this,PolymorphicEmitInfo other)

{
  uint32 uVar1;
  uint32 uVar2;
  EmitInfo EVar3;
  WasmType WStack_38;
  WasmType WStack_30;
  uint local_2c;
  uint32 i;
  PolymorphicEmitInfo *this_local;
  PolymorphicEmitInfo other_local;
  
  other_local._0_8_ = other.field_1;
  this_local._0_4_ = other.count;
  uVar1 = Count(this);
  uVar2 = Count((PolymorphicEmitInfo *)&this_local);
  if (uVar1 == uVar2) {
    for (local_2c = 0; uVar1 = Count(this), local_2c < uVar1; local_2c = local_2c + 1) {
      EVar3 = GetInfo(this,local_2c);
      WStack_30 = EVar3.type;
      EVar3 = GetInfo((PolymorphicEmitInfo *)&this_local,local_2c);
      WStack_38 = EVar3.type;
      if (WStack_30 != WStack_38) {
        return false;
      }
    }
    other_local.field_1.singleInfo.type._3_1_ = 1;
  }
  else {
    other_local.field_1.singleInfo.type._3_1_ = 0;
  }
  return (bool)other_local.field_1.singleInfo.type._3_1_;
}

Assistant:

bool PolymorphicEmitInfo::IsEquivalent(PolymorphicEmitInfo other) const
{
    if (Count() != other.Count())
    {
        return false;
    }
    for (uint32 i = 0; i < Count(); ++i)
    {
        if (GetInfo(i).type != other.GetInfo(i).type)
        {
            return false;
        }
    }
    return true;
}